

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void __thiscall tl::Vector<LoadedImage>::grow(Vector<LoadedImage> *this,size_t capacity)

{
  LoadedImage *__src;
  LoadedImage *__dest;
  ulong uVar1;
  
  uVar1 = 0x40;
  if ((0x40 < capacity) && (uVar1 = 0x100, 0x100 < capacity)) {
    uVar1 = capacity - 1 >> 1 | capacity - 1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    uVar1 = uVar1 >> 0x10 | uVar1;
    reserve(this,(uVar1 >> 0x20 | uVar1) + 1);
    return;
  }
  if (this->_capacity < uVar1) {
    __dest = (LoadedImage *)operator_new__(uVar1 << 4);
    __src = this->_data;
    if (__src != (LoadedImage *)0x0) {
      memcpy(__dest,__src,this->_size << 4);
      operator_delete__(__src);
    }
    this->_data = __dest;
    this->_capacity = uVar1;
  }
  return;
}

Assistant:

void Vector<T>::grow(size_t capacity)noexcept
{
    if(capacity <= 64) {
        reserve(64);
    }
    else if(capacity <= 256) {
        reserve(256);
    }
    else {
       const size_t n = nextPowerOf2(capacity);
       reserve(n);
    }
}